

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QItemViewPaintPair>::emplace<QItemViewPaintPair>
          (QMovableArrayOps<QItemViewPaintPair> *this,qsizetype i,QItemViewPaintPair *args)

{
  QItemViewPaintPair **ppQVar1;
  qsizetype *pqVar2;
  QItemViewPaintPair *pQVar3;
  QModelIndex *pQVar4;
  long lVar5;
  Data *pDVar6;
  QItemViewPaintPair *pQVar7;
  QAbstractItemModel *pQVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  quintptr qVar21;
  long in_FS_OFFSET;
  bool bVar22;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
           super_QArrayDataPointer<QItemViewPaintPair>.d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00543fc7:
    pQVar8 = (args->index).m.ptr;
    uVar15 = (args->rect).x1;
    uVar16 = (args->rect).y1;
    uVar17 = (args->rect).x2;
    uVar18 = (args->rect).y2;
    uVar19 = (args->index).r;
    uVar20 = (args->index).c;
    qVar21 = (args->index).i;
    bVar22 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
             super_QArrayDataPointer<QItemViewPaintPair>.size != 0;
    QArrayDataPointer<QItemViewPaintPair>::detachAndGrow
              ((QArrayDataPointer<QItemViewPaintPair> *)this,(uint)(i == 0 && bVar22),1,
               (QItemViewPaintPair **)0x0,(QArrayDataPointer<QItemViewPaintPair> *)0x0);
    pQVar7 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
             super_QArrayDataPointer<QItemViewPaintPair>.ptr;
    uStack_40 = (undefined4)qVar21;
    uStack_3c = (undefined4)(qVar21 >> 0x20);
    if (i != 0 || !bVar22) {
      pQVar3 = pQVar7 + i;
      memmove(pQVar3 + 1,pQVar7 + i,
              ((this->super_QGenericArrayOps<QItemViewPaintPair>).
               super_QArrayDataPointer<QItemViewPaintPair>.size - i) * 0x28);
      (pQVar3->rect).x1.m_i = uVar15;
      (pQVar3->rect).y1.m_i = uVar16;
      (pQVar3->rect).x2.m_i = uVar17;
      (pQVar3->rect).y2.m_i = uVar18;
      (pQVar3->index).r = uVar19;
      (pQVar3->index).c = uVar20;
      *(undefined4 *)&(pQVar3->index).i = uStack_40;
      *(undefined4 *)((long)&(pQVar3->index).i + 4) = uStack_3c;
      (pQVar3->index).m.ptr = pQVar8;
      goto LAB_00544075;
    }
    pQVar7[-1].index.m.ptr = pQVar8;
    pQVar7[-1].index.r = uVar19;
    pQVar7[-1].index.c = uVar20;
    *(undefined4 *)&pQVar7[-1].index.i = uStack_40;
    *(undefined4 *)((long)&pQVar7[-1].index.i + 4) = uStack_3c;
    pQVar7[-1].rect.x1.m_i = uVar15;
    pQVar7[-1].rect.y1.m_i = uVar16;
    pQVar7[-1].rect.x2.m_i = uVar17;
    pQVar7[-1].rect.y2.m_i = uVar18;
  }
  else {
    if (((this->super_QGenericArrayOps<QItemViewPaintPair>).
         super_QArrayDataPointer<QItemViewPaintPair>.size == i) &&
       (pQVar7 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
                 super_QArrayDataPointer<QItemViewPaintPair>.ptr,
       (pDVar6->super_QArrayData).alloc - i !=
       ((long)((long)pQVar7 -
              ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x3333333333333333)) {
      pQVar7[i].index.m.ptr = (args->index).m.ptr;
      iVar9 = (args->rect).x1.m_i;
      iVar10 = (args->rect).y1.m_i;
      iVar11 = (args->rect).x2.m_i;
      iVar12 = (args->rect).y2.m_i;
      iVar13 = (args->index).c;
      qVar21 = (args->index).i;
      uVar14 = *(undefined4 *)((long)&(args->index).i + 4);
      pQVar4 = &pQVar7[i].index;
      pQVar4->r = (args->index).r;
      pQVar4->c = iVar13;
      *(int *)&pQVar4->i = (int)qVar21;
      *(undefined4 *)((long)&pQVar4->i + 4) = uVar14;
      pQVar7 = pQVar7 + i;
      (pQVar7->rect).x1.m_i = iVar9;
      (pQVar7->rect).y1.m_i = iVar10;
      (pQVar7->rect).x2.m_i = iVar11;
      (pQVar7->rect).y2.m_i = iVar12;
      goto LAB_00544075;
    }
    if ((i != 0) ||
       (pQVar7 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
                 super_QArrayDataPointer<QItemViewPaintPair>.ptr,
       (QItemViewPaintPair *)
       ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar7))
    goto LAB_00543fc7;
    pQVar7[-1].index.m.ptr = (args->index).m.ptr;
    iVar9 = (args->rect).x1.m_i;
    iVar10 = (args->rect).y1.m_i;
    iVar11 = (args->rect).x2.m_i;
    iVar12 = (args->rect).y2.m_i;
    iVar13 = (args->index).c;
    qVar21 = (args->index).i;
    uVar14 = *(undefined4 *)((long)&(args->index).i + 4);
    pQVar7[-1].index.r = (args->index).r;
    pQVar7[-1].index.c = iVar13;
    *(int *)&pQVar7[-1].index.i = (int)qVar21;
    *(undefined4 *)((long)&pQVar7[-1].index.i + 4) = uVar14;
    pQVar7[-1].rect.x1.m_i = iVar9;
    pQVar7[-1].rect.y1.m_i = iVar10;
    pQVar7[-1].rect.x2.m_i = iVar11;
    pQVar7[-1].rect.y2.m_i = iVar12;
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QItemViewPaintPair>).
             super_QArrayDataPointer<QItemViewPaintPair>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_00544075:
  pqVar2 = &(this->super_QGenericArrayOps<QItemViewPaintPair>).
            super_QArrayDataPointer<QItemViewPaintPair>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }